

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

float absl::lts_20250127::anon_unknown_0::FloatTraits<float>::MakeNan(Nonnull<const_char_*> tagp)

{
  float fVar1;
  Nonnull<const_char_*> tagp_local;
  
  fVar1 = nanf(tagp);
  return fVar1;
}

Assistant:

static float MakeNan(absl::Nonnull<const char*> tagp) {
#if ABSL_HAVE_BUILTIN(__builtin_nanf)
    // Use __builtin_nanf() if available since it has a fix for
    // https://bugs.llvm.org/show_bug.cgi?id=37778
    // std::nanf may use the glibc implementation.
    return __builtin_nanf(tagp);
#else
    // Support nanf no matter which namespace it's in.  Some platforms
    // incorrectly don't put it in namespace std.
    using namespace std;  // NOLINT
    return std::nanf(tagp);
#endif
  }